

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O3

Expression * __thiscall
wasm::SafeHeap::makeBoundsCheck
          (SafeHeap *this,Type type,Builder *builder,Index ptrLocal,Index sumLocal,Index bytes,
          Module *module,Type addressType,bool is64,Name memory)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  Expression **ppEVar4;
  Index IVar5;
  BinaryOp BVar6;
  Expression *pEVar7;
  Const *pCVar8;
  Binary *pBVar9;
  Binary *this_00;
  Expression *pEVar10;
  Binary *this_01;
  Call *pCVar11;
  Block *pBVar12;
  If *this_02;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  ulong uVar13;
  uint uVar14;
  BinaryOp BVar15;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  optional<wasm::Type> type_;
  optional<wasm::Type> type_00;
  Const *local_88;
  SafeHeap *local_80;
  Binary *local_78;
  Builder *local_70;
  Load *local_68;
  Index local_60;
  BinaryOp local_5c;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Index local_3c;
  allocator_type local_35;
  BinaryOp local_34;
  
  pcVar2 = (this->sbrk).super_IString.str._M_str;
  bVar1 = (((this->super_Pass).runner)->options).lowMemoryUnused;
  local_5c = (uint)bVar1 + (uint)bVar1 * 2 + EqInt32;
  if (is64) {
    local_5c = (uint)bVar1 + (uint)bVar1 * 2 + EqInt64;
  }
  local_34 = bytes;
  local_80 = this;
  local_60 = ptrLocal;
  local_3c = sumLocal;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (this->dynamicTopPtr).super_IString.str._M_str;
    local_70 = builder;
    if (pcVar2 == (char *)0x0) {
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar11 = Builder::makeCall(builder,(Name)(this->getSbrkPtr).super_IString.str,&local_58,
                                  addressType,false);
      if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      ppEVar4 = (Expression **)(this->dynamicTopPtr).super_IString.str._M_len;
      pCVar11 = (Call *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
      (pCVar11->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id =
           GlobalGetId;
      (pCVar11->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .data = ppEVar4;
      (pCVar11->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements = (size_t)pcVar2;
      (pCVar11->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
           addressType.id;
    }
    builder = local_70;
    uVar14 = (uint)is64 * 4 + 4;
    local_68 = (Load *)MixedArena::allocSpace(&local_70->wasm->allocator,0x48,8);
    (local_68->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    local_68->isAtomic = false;
    local_68->bytes = (uint8_t)uVar14;
    local_68->signed_ = false;
    (local_68->offset).addr = 0;
    (local_68->align).addr = (ulong)uVar14;
    local_68->ptr = (Expression *)pCVar11;
    (local_68->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id =
         addressType.id;
    (local_68->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
    (local_68->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
    Load::finalize(local_68);
  }
  else {
    sVar3 = (this->sbrk).super_IString.str._M_len;
    local_88 = Builder::makeConstPtr(builder,0,addressType);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_88;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_58,__l,&local_35);
    target.super_IString.str._M_str = pcVar2;
    target.super_IString.str._M_len = sVar3;
    local_68 = (Load *)Builder::makeCall(builder,target,&local_58,addressType,false);
    if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pEVar7 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  IVar5 = local_3c;
  pEVar7->_id = LocalGetId;
  *(Index *)(pEVar7 + 1) = local_3c;
  (pEVar7->type).id = addressType.id;
  pCVar8 = Builder::makeConstPtr(builder,(ulong)bVar1 << 10,addressType);
  local_78 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (local_78->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (local_78->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  local_78->op = local_5c;
  local_78->left = pEVar7;
  local_78->right = (Expression *)pCVar8;
  Binary::finalize(local_78);
  pEVar7 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar7->_id = LocalGetId;
  *(Index *)(pEVar7 + 1) = IVar5;
  (pEVar7->type).id = addressType.id;
  pCVar8 = Builder::makeConstPtr(builder,(ulong)local_34,addressType);
  pBVar9 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  BVar15 = GtUInt32;
  if (is64) {
    BVar15 = GtUInt64;
  }
  BVar6 = AddInt64;
  if (!is64) {
    BVar6 = AddInt32;
  }
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar9->op = BVar6;
  pBVar9->left = pEVar7;
  pBVar9->right = (Expression *)pCVar8;
  local_34 = LtUInt32;
  if (is64) {
    local_34 = LtUInt64;
  }
  Binary::finalize(pBVar9);
  this_00 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = BVar15;
  this_00->left = (Expression *)pBVar9;
  this_00->right = (Expression *)local_68;
  Binary::finalize(this_00);
  pEVar7 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar7->_id = LocalGetId;
  *(Index *)(pEVar7 + 1) = local_3c;
  (pEVar7->type).id = addressType.id;
  pEVar10 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar10->_id = LocalGetId;
  *(Index *)(pEVar10 + 1) = local_60;
  (pEVar10->type).id = addressType.id;
  pBVar9 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar9->op = local_34;
  pBVar9->left = pEVar7;
  pBVar9->right = pEVar10;
  Binary::finalize(pBVar9);
  this_01 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = OrInt32;
  this_01->left = (Expression *)this_00;
  this_01->right = (Expression *)pBVar9;
  Binary::finalize(this_01);
  pBVar9 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar9->op = OrInt32;
  pBVar9->left = (Expression *)local_78;
  pBVar9->right = (Expression *)this_01;
  Binary::finalize(pBVar9);
  args = &local_58;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar11 = Builder::makeCall(builder,(Name)(local_80->segfault).super_IString.str,args,(Type)0x0,
                              false);
  pEVar7 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x10,8);
  pEVar7->_id = UnreachableId;
  (pEVar7->type).id = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args;
  pBVar12 = Builder::makeSequence(builder,(Expression *)pCVar11,pEVar7,type_00);
  uVar13 = 0x28;
  this_02 = (If *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_02->condition = (Expression *)pBVar9;
  this_02->ifTrue = (Expression *)pBVar12;
  this_02->ifFalse = (Expression *)0x0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
  If::finalize(this_02,type_);
  if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Expression *)this_02;
}

Assistant:

Expression* makeBoundsCheck(Type type,
                              Builder& builder,
                              Index ptrLocal,
                              Index sumLocal,
                              Index bytes,
                              Module* module,
                              Type addressType,
                              bool is64,
                              Name memory) {
    bool lowMemUnused = getPassOptions().lowMemoryUnused;
    auto upperOp = is64 ? lowMemUnused ? LtUInt64 : EqInt64
                        : lowMemUnused ? LtUInt32 : EqInt32;
    auto upperBound = lowMemUnused ? PassOptions::LowMemoryBound : 0;
    Expression* brkLocation;
    if (sbrk.is()) {
      brkLocation = builder.makeCall(
        sbrk, {builder.makeConstPtr(0, addressType)}, addressType);
    } else {
      Expression* sbrkPtr;
      if (dynamicTopPtr.is()) {
        sbrkPtr = builder.makeGlobalGet(dynamicTopPtr, addressType);
      } else {
        sbrkPtr = builder.makeCall(getSbrkPtr, {}, addressType);
      }
      auto size = is64 ? 8 : 4;
      brkLocation =
        builder.makeLoad(size, false, 0, size, sbrkPtr, addressType, memory);
    }
    auto gtuOp = is64 ? GtUInt64 : GtUInt32;
    auto addOp = is64 ? AddInt64 : AddInt32;
    auto* upperCheck =
      builder.makeBinary(upperOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(upperBound, addressType));
    auto* lowerCheck = builder.makeBinary(
      gtuOp,
      builder.makeBinary(addOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(bytes, addressType)),
      brkLocation);
    // Check for an overflow when adding the pointer and the size, using the
    // rule that for any unsigned x and y,
    //    x + y < x    <=>   x + y overflows
    auto* overflowCheck =
      builder.makeBinary(is64 ? LtUInt64 : LtUInt32,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeLocalGet(ptrLocal, addressType));
    // Add an unreachable right after the call to segfault for performance
    // reasons: the call never returns, and this helps optimizations benefit
    // from that.
    return builder.makeIf(
      builder.makeBinary(
        OrInt32,
        upperCheck,
        builder.makeBinary(OrInt32, lowerCheck, overflowCheck)),
      builder.makeSequence(builder.makeCall(segfault, {}, Type::none),
                           builder.makeUnreachable()));
  }